

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fAndroidExtensionPackES31ATests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::AndroidExtensionPackES31ATests::init
          (AndroidExtensionPackES31ATests *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  undefined4 uVar3;
  char *pcVar4;
  _func_int **pp_Var5;
  int extraout_EAX;
  TestNode *pTVar6;
  long *plVar7;
  undefined8 *puVar8;
  TestNode *pTVar9;
  long *plVar10;
  ulong *puVar11;
  size_type *psVar12;
  long lVar13;
  undefined8 uVar14;
  ulong uVar15;
  string name;
  string description;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  TestNode *local_250;
  TestNode *local_248;
  int local_23c;
  ulong *local_238;
  long local_230;
  ulong local_228 [2];
  TestNode *local_218;
  long *local_210;
  long local_208;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  TestNode *local_1b0;
  string local_1a8 [3];
  ios_base local_138 [264];
  
  pTVar6 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar6,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"limits",
             "Implementation limits");
  tcu::TestNode::addChild((TestNode *)this,pTVar6);
  lVar13 = 0;
  local_218 = (TestNode *)this;
  local_1b0 = pTVar6;
  do {
    pTVar6 = (TestNode *)operator_new(0x80);
    local_248 = (TestNode *)((TestNode *)((long)this + 0x70))->_vptr_TestNode;
    pcVar4 = *(char **)((long)&init::limits[0].name + lVar13);
    local_1c8 = 0;
    local_1c0 = 0;
    local_1d0 = &local_1c0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d0);
    local_210 = &local_200;
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_200 = *plVar10;
      lStack_1f8 = plVar7[3];
    }
    else {
      local_200 = *plVar10;
      local_210 = (long *)*plVar7;
    }
    local_208 = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_210);
    local_1f0 = &local_1e0;
    plVar10 = plVar7 + 2;
    if ((long *)*plVar7 == plVar10) {
      local_1e0 = *plVar10;
      lStack_1d8 = plVar7[3];
    }
    else {
      local_1e0 = *plVar10;
      local_1f0 = (long *)*plVar7;
    }
    local_1e8 = plVar7[1];
    *plVar7 = (long)plVar10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_1f0);
    puVar11 = (ulong *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_270.field_2._M_allocated_capacity = *puVar11;
      local_270.field_2._8_8_ = plVar7[3];
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    }
    else {
      local_270.field_2._M_allocated_capacity = *puVar11;
      local_270._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_270._M_string_length = plVar7[1];
    *plVar7 = (long)puVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    iVar2 = *(int *)((long)&init::limits[0].limit + lVar13);
    std::ostream::operator<<(local_1a8,iVar2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar14 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      uVar14 = local_270.field_2._M_allocated_capacity;
    }
    local_250 = pTVar6;
    local_23c = iVar2;
    if ((ulong)uVar14 < local_230 + local_270._M_string_length) {
      uVar15 = 0xf;
      if (local_238 != local_228) {
        uVar15 = local_228[0];
      }
      if (uVar15 < local_230 + local_270._M_string_length) goto LAB_0065753c;
      puVar8 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_238,0,(char *)0x0,(ulong)local_270._M_dataplus._M_p);
    }
    else {
LAB_0065753c:
      puVar8 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_270,(ulong)local_238);
    }
    pTVar9 = local_248;
    pTVar6 = local_250;
    psVar12 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_290.field_2._M_allocated_capacity = *psVar12;
      local_290.field_2._8_8_ = puVar8[3];
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    }
    else {
      local_290.field_2._M_allocated_capacity = *psVar12;
      local_290._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_290._M_string_length = puVar8[1];
    *puVar8 = psVar12;
    puVar8[1] = 0;
    *(undefined1 *)psVar12 = 0;
    uVar3 = *(undefined4 *)((long)&init::limits[0].target + lVar13);
    tcu::TestCase::TestCase
              ((TestCase *)local_250,(TestContext *)local_248->_vptr_TestNode,pcVar4,
               local_290._M_dataplus._M_p);
    pTVar6[1]._vptr_TestNode = (_func_int **)pTVar9;
    pTVar6->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b592d8;
    *(undefined4 *)&pTVar6[1].m_testCtx = uVar3;
    *(int *)((long)&pTVar6[1].m_testCtx + 4) = local_23c;
    tcu::TestNode::addChild(local_1b0,pTVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    this = (AndroidExtensionPackES31ATests *)local_218;
    if (local_238 != local_228) {
      operator_delete(local_238,local_228[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if (local_1f0 != &local_1e0) {
      operator_delete(local_1f0,local_1e0 + 1);
    }
    if (local_210 != &local_200) {
      operator_delete(local_210,local_200 + 1);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
    }
    lVar13 = lVar13 + 0x10;
    if (lVar13 == 0x40) {
      pTVar6 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"extensions",
                 "Required extensions");
      local_248 = pTVar6;
      tcu::TestNode::addChild((TestNode *)this,pTVar6);
      paVar1 = &local_1a8[0].field_2;
      lVar13 = 0;
      do {
        pcVar4 = *(char **)((long)init::subExtensions + lVar13);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,pcVar4 + 3,(allocator<char> *)&local_270);
        de::toLower(&local_290,local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        std::operator+(&local_270,"Check that extension ",&local_290);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_270);
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_1a8[0].field_2._0_8_ = *psVar12;
          local_1a8[0].field_2._8_8_ = plVar7[3];
          local_1a8[0]._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1a8[0].field_2._0_8_ = *psVar12;
          local_1a8[0]._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1a8[0]._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        pTVar6 = (TestNode *)operator_new(0x98);
        pp_Var5 = ((TestNode *)((long)this + 0x70))->_vptr_TestNode;
        tcu::TestCase::TestCase
                  ((TestCase *)pTVar6,(TestContext *)*pp_Var5,local_290._M_dataplus._M_p,
                   local_1a8[0]._M_dataplus._M_p);
        pTVar6[1]._vptr_TestNode = pp_Var5;
        pTVar6->_vptr_TestNode = (_func_int **)&PTR__SubExtensionCase_00b59340;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pTVar6[1].m_testCtx,pcVar4,(allocator<char> *)&local_270);
        tcu::TestNode::addChild(local_248,pTVar6);
        this = (AndroidExtensionPackES31ATests *)local_218;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        lVar13 = lVar13 + 8;
      } while (lVar13 != 0xa0);
      gls::ShaderLibrary::ShaderLibrary
                ((ShaderLibrary *)local_1a8,((TestNode *)this)->m_testCtx,
                 (RenderContext *)((TestNode *)((long)this + 0x70))->_vptr_TestNode[1],
                 (ContextInfo *)((TestNode *)((long)this + 0x70))->_vptr_TestNode[2]);
      pTVar6 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar6,((TestNode *)this)->m_testCtx,"shaders","Shader tests");
      gls::ShaderLibrary::loadShaderFile
                ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_290,
                 (ShaderLibrary *)local_1a8,"shaders/es31/android_extension_pack.test");
      pTVar9 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,((TestNode *)this)->m_testCtx,"es31",
                 "GLSL ES 3.1 Shader tests",
                 (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_290);
      tcu::TestNode::addChild(pTVar6,pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_290._M_dataplus._M_p,
                        local_290.field_2._M_allocated_capacity - (long)local_290._M_dataplus._M_p);
      }
      gls::ShaderLibrary::loadShaderFile
                ((vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_290,
                 (ShaderLibrary *)local_1a8,"shaders/es32/android_extension_pack.test");
      pTVar9 = (TestNode *)operator_new(0x70);
      tcu::TestCaseGroup::TestCaseGroup
                ((TestCaseGroup *)pTVar9,((TestNode *)this)->m_testCtx,"es32",
                 "GLSL ES 3.2 Shader tests",
                 (vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *)&local_290);
      tcu::TestNode::addChild(pTVar6,pTVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_290._M_dataplus._M_p,
                        local_290.field_2._M_allocated_capacity - (long)local_290._M_dataplus._M_p);
      }
      tcu::TestNode::addChild((TestNode *)this,pTVar6);
      gls::ShaderLibrary::~ShaderLibrary((ShaderLibrary *)local_1a8);
      return extraout_EAX;
    }
  } while( true );
}

Assistant:

void AndroidExtensionPackES31ATests::init (void)
{
	// .limits
	{
		static const struct
		{
			const char*	name;
			glw::GLenum	target;
			int			limit;
		} limits[] =
		{
			{
				"max_fragment_atomic_counter_buffers",
				GL_MAX_FRAGMENT_ATOMIC_COUNTER_BUFFERS,
				1
			},
			{
				"max_fragment_atomic_counters",
				GL_MAX_FRAGMENT_ATOMIC_COUNTERS,
				8
			},
			{
				"max_fragment_image_uniforms",
				GL_MAX_FRAGMENT_IMAGE_UNIFORMS,
				4
			},
			{
				"max_fragment_shader_storage_blocks",
				GL_MAX_FRAGMENT_SHADER_STORAGE_BLOCKS,
				4
			},
		};

		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "limits", "Implementation limits");
		addChild(group);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(limits); ++ndx)
			group->addChild(new ImplementationLimitCase(m_context,
														limits[ndx].name,
														(std::string() + "Check " + limits[ndx].name + " is at least " + de::toString(limits[ndx].limit)).c_str(),
														limits[ndx].target,
														limits[ndx].limit));
	}

	// .extensions
	{
		static const char* const subExtensions[] =
		{
			"GL_KHR_debug",
			"GL_KHR_texture_compression_astc_ldr",
			"GL_KHR_blend_equation_advanced",
			"GL_OES_sample_shading",
			"GL_OES_sample_variables",
			"GL_OES_shader_image_atomic",
			"GL_OES_shader_multisample_interpolation",
			"GL_OES_texture_stencil8",
			"GL_OES_texture_storage_multisample_2d_array",
			"GL_EXT_copy_image",
			"GL_EXT_draw_buffers_indexed",
			"GL_EXT_geometry_shader",
			"GL_EXT_gpu_shader5",
			"GL_EXT_primitive_bounding_box",
			"GL_EXT_shader_io_blocks",
			"GL_EXT_tessellation_shader",
			"GL_EXT_texture_border_clamp",
			"GL_EXT_texture_buffer",
			"GL_EXT_texture_cube_map_array",
			"GL_EXT_texture_sRGB_decode",
		};

		tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "extensions", "Required extensions");
		addChild(group);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(subExtensions); ++ndx)
		{
			const std::string name			= genExtensionTestName(subExtensions[ndx]);
			const std::string description	= "Check that extension " + name + " is supported if extension pack is supported";
			group->addChild(new SubExtensionCase(m_context, name.c_str(), description.c_str(), subExtensions[ndx]));
		}
	}

	// .shaders
	{
		gls::ShaderLibrary					shaderLibrary	(m_testCtx, m_context.getRenderContext(), m_context.getContextInfo());
		tcu::TestCaseGroup* const			group			= new tcu::TestCaseGroup(m_testCtx, "shaders", "Shader tests");

		{
			const std::vector<tcu::TestNode*>&	children		= shaderLibrary.loadShaderFile("shaders/es31/android_extension_pack.test");
			tcu::TestCaseGroup* const			groupES31		= new tcu::TestCaseGroup(m_testCtx, "es31", "GLSL ES 3.1 Shader tests", children);

			group->addChild(groupES31);
		}

		{
			const std::vector<tcu::TestNode*>&	children		= shaderLibrary.loadShaderFile("shaders/es32/android_extension_pack.test");
			tcu::TestCaseGroup* const			groupES32		= new tcu::TestCaseGroup(m_testCtx, "es32", "GLSL ES 3.2 Shader tests", children);

			group->addChild(groupES32);
		}

		addChild(group);
	}
}